

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

void __thiscall
banksia::ChessBoard::genLegalOnly
          (ChessBoard *this,vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *moveList,
          Side attackerSide)

{
  pointer pMVar1;
  int iVar2;
  MoveFull *move;
  pointer __x;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> moves;
  Hist hist;
  _Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> local_d8;
  Hist local_c0;
  
  (*(this->super_BoardCore).super_Obj._vptr_Obj[0x11])();
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.moveString._M_dataplus._M_p = (pointer)&local_c0.moveString.field_2;
  local_c0.moveString._M_string_length = 0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.moveString.field_2._M_local_buf[0] = '\0';
  local_c0.comment._M_dataplus._M_p = (pointer)&local_c0.comment.field_2;
  local_c0.comment._M_string_length = 0;
  local_c0.comment.field_2._M_local_buf[0] = '\0';
  local_c0.elapsed = 0.0;
  local_c0.nodes = 0;
  local_c0.score = 0;
  local_c0.depth = 0;
  pMVar1 = (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (__x = (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
             _M_impl.super__Vector_impl_data._M_start; __x != pMVar1; __x = __x + 1) {
    (*(this->super_BoardCore).super_Obj._vptr_Obj[0x15])(this,__x,&local_c0);
    iVar2 = (*(this->super_BoardCore).super_Obj._vptr_Obj[0x13])(this,(ulong)attackerSide);
    if ((char)iVar2 == '\0') {
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::push_back
                ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)&local_d8,__x);
    }
    (*(this->super_BoardCore).super_Obj._vptr_Obj[0x16])(this,&local_c0);
  }
  std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::operator=
            (moveList,(vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)&local_d8);
  Hist::~Hist(&local_c0);
  std::_Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::~_Vector_base(&local_d8)
  ;
  return;
}

Assistant:

void ChessBoard::genLegalOnly(std::vector<MoveFull>& moveList, Side attackerSide) {
    gen(moveList, attackerSide);
    
    std::vector<MoveFull> moves;
    Hist hist;
    for (auto && move : moveList) {
        make(move, hist);
        if (!isIncheck(attackerSide)) {
            moves.push_back(move);
        }
        takeBack(hist);
    }
    moveList = moves;
}